

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

Vertex * __thiscall Graph::findVertex(Graph *this,int id)

{
  Vertex *pVVar1;
  
  while( true ) {
    pVVar1 = this->verticesList;
    if ((pVVar1 == (Vertex *)0x0) || (pVVar1->id == id)) break;
    this = (Graph *)&pVVar1->nextVertex;
  }
  return pVVar1;
}

Assistant:

Vertex *Graph::findVertex(int id){

    Vertex *v = verticesList;
    while(v!=NULL){
        if(v->getID() == id)
            return v;
        v = v->getNext();
    }
    return NULL;

}